

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxStaticArrayVariable::FxStaticArrayVariable
          (FxStaticArrayVariable *this,FxLocalVariableDeclaration *var,FScriptPosition *sc)

{
  FScriptPosition *sc_local;
  FxLocalVariableDeclaration *var_local;
  FxStaticArrayVariable *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_StaticArrayVariable,sc);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxStaticArrayVariable_00a0ad38
  ;
  this->Variable = (FxStaticArray *)var;
  (this->super_FxExpression).ValueType =
       (this->Variable->super_FxLocalVariableDeclaration).super_FxExpression.ValueType;
  return;
}

Assistant:

FxStaticArrayVariable::FxStaticArrayVariable(FxLocalVariableDeclaration *var, const FScriptPosition &sc)
	: FxExpression(EFX_StaticArrayVariable, sc)
{
	Variable = static_cast<FxStaticArray*>(var);
	ValueType = Variable->ValueType;
}